

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall testing::internal::GTestFlagSaver::~GTestFlagSaver(GTestFlagSaver *this)

{
  byte *in_RDI;
  
  FLAGS_gtest_also_run_disabled_tests = *in_RDI & 1;
  FLAGS_gtest_break_on_failure = in_RDI[1] & 1;
  FLAGS_gtest_catch_exceptions = in_RDI[2] & 1;
  std::__cxx11::string::operator=((string *)FLAGS_gtest_color_abi_cxx11_,(string *)(in_RDI + 8));
  std::__cxx11::string::operator=
            ((string *)FLAGS_gtest_death_test_style_abi_cxx11_,(string *)(in_RDI + 0x28));
  FLAGS_gtest_death_test_use_fork = in_RDI[0x48] & 1;
  std::__cxx11::string::operator=((string *)FLAGS_gtest_filter_abi_cxx11_,(string *)(in_RDI + 0x50))
  ;
  std::__cxx11::string::operator=
            ((string *)FLAGS_gtest_internal_run_death_test_abi_cxx11_,(string *)(in_RDI + 0x70));
  FLAGS_gtest_list_tests = in_RDI[0x90] & 1;
  std::__cxx11::string::operator=((string *)FLAGS_gtest_output_abi_cxx11_,(string *)(in_RDI + 0x98))
  ;
  FLAGS_gtest_print_time = in_RDI[0xb8] & 1;
  FLAGS_gtest_random_seed = *(undefined4 *)(in_RDI + 0xbc);
  FLAGS_gtest_repeat = *(undefined4 *)(in_RDI + 0xc0);
  FLAGS_gtest_shuffle = in_RDI[0xc4] & 1;
  FLAGS_gtest_stack_trace_depth = *(undefined4 *)(in_RDI + 200);
  std::__cxx11::string::operator=
            ((string *)FLAGS_gtest_stream_result_to_abi_cxx11_,(string *)(in_RDI + 0xd0));
  FLAGS_gtest_throw_on_failure = in_RDI[0xf0] & 1;
  std::__cxx11::string::~string((string *)(in_RDI + 0xd0));
  std::__cxx11::string::~string((string *)(in_RDI + 0x98));
  std::__cxx11::string::~string((string *)(in_RDI + 0x70));
  std::__cxx11::string::~string((string *)(in_RDI + 0x50));
  std::__cxx11::string::~string((string *)(in_RDI + 0x28));
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

~GTestFlagSaver() {
    GTEST_FLAG(also_run_disabled_tests) = also_run_disabled_tests_;
    GTEST_FLAG(break_on_failure) = break_on_failure_;
    GTEST_FLAG(catch_exceptions) = catch_exceptions_;
    GTEST_FLAG(color) = color_;
    GTEST_FLAG(death_test_style) = death_test_style_;
    GTEST_FLAG(death_test_use_fork) = death_test_use_fork_;
    GTEST_FLAG(filter) = filter_;
    GTEST_FLAG(internal_run_death_test) = internal_run_death_test_;
    GTEST_FLAG(list_tests) = list_tests_;
    GTEST_FLAG(output) = output_;
    GTEST_FLAG(print_time) = print_time_;
    GTEST_FLAG(random_seed) = random_seed_;
    GTEST_FLAG(repeat) = repeat_;
    GTEST_FLAG(shuffle) = shuffle_;
    GTEST_FLAG(stack_trace_depth) = stack_trace_depth_;
    GTEST_FLAG(stream_result_to) = stream_result_to_;
    GTEST_FLAG(throw_on_failure) = throw_on_failure_;
  }